

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O1

FT_Error BDF_Face_Init(FT_Stream stream,FT_Face bdfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  char cVar1;
  bdf_font_t *font;
  char *pcVar2;
  void *__src;
  bdf_glyph_t *pbVar3;
  undefined1 auVar4 [16];
  FT_Error FVar5;
  short sVar6;
  short sVar7;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  ulong *P;
  undefined1 *block;
  FT_ULong FVar11;
  bdf_property_t *pbVar12;
  FT_String *pFVar13;
  size_t sVar14;
  size_t sVar15;
  FT_Bitmap_Size *pFVar16;
  ulong uVar17;
  FT_Pointer pvVar18;
  undefined2 *puVar19;
  bdf_property_t *pbVar20;
  byte *pbVar21;
  int iVar22;
  anon_union_8_3_ccdffb78_for_value *paVar23;
  short sVar24;
  FT_Memory pFVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  FT_ULong __n;
  FT_Long FVar31;
  FT_Face pFVar32;
  long *plVar33;
  FT_Memory memory;
  bdf_font_t *font_00;
  bool bVar34;
  undefined8 uStack_f0;
  bdf_options_t options;
  long local_d0;
  size_t local_c8;
  FT_Error error_1;
  FT_Int local_9c;
  undefined1 *local_98;
  ulong local_90;
  FT_ULong local_88;
  long local_80;
  undefined1 auStack_78 [8];
  _bdf_line_func_t cb;
  char *local_68;
  char *pcStack_60;
  FT_Memory local_58;
  ulong *local_50;
  FT_Memory local_48;
  FT_Face local_40;
  FT_Error local_38;
  FT_Error local_34;
  FT_Error error_2;
  FT_Error error;
  
  local_34 = 0;
  pFVar25 = bdfface->memory;
  local_9c = face_index;
  local_34 = FT_Stream_Seek(stream,0);
  if (local_34 != 0) {
    return local_34;
  }
  uStack_f0 = 0x100000001;
  options.correct_metrics = 0;
  options.keep_unencoded = 8;
  local_38 = 0;
  P = (ulong *)ft_mem_alloc(pFVar25,0x44078,&local_38);
  local_48 = pFVar25;
  local_40 = bdfface;
  if (local_38 == 0) {
    P[8] = (ulong)&uStack_f0;
    *(undefined2 *)(P + 3) = 0x7fff;
    P[0x880e] = stream->size;
    P[0x880d] = (ulong)pFVar25;
    P[0x880b] = 0;
    P[0x880c] = 0;
    P[0x8809] = 0;
    P[0x880a] = 0;
    P[0x880c] = (ulong)pFVar25;
    memory = stream->memory;
    local_c8 = local_c8 & 0xffffffff00000000;
    local_50 = P;
    block = (undefined1 *)ft_mem_realloc(memory,1,0,0x400,(void *)0x0,(FT_Error *)&local_c8);
    if ((int)local_c8 == 0) {
      local_90 = 0x400;
      local_d0 = 1;
      auStack_78 = (undefined1  [8])_bdf_parse_start;
      *block = 0;
      iVar10 = 0x100;
      __n = 0;
      sVar14 = 0;
      lVar29 = 0;
      local_58 = memory;
LAB_001f7280:
      do {
        local_98 = block;
        bVar34 = false;
        FVar11 = __n;
        block = local_98;
        lVar27 = lVar29;
        lVar29 = 0;
        while( true ) {
          while( true ) {
            if (!bVar34) {
              FVar11 = FT_Stream_TryRead(stream,block + sVar14,local_90 - sVar14);
              lVar27 = FVar11 + sVar14;
              sVar14 = 0;
              block = local_98;
            }
            memory = local_58;
            uVar17 = local_90;
            __n = lVar27 - lVar29;
            if (__n == 0 || lVar27 < lVar29) goto LAB_001f73d6;
            if (iVar10 != (char)block[lVar29]) break;
            iVar10 = 0x100;
            bVar34 = true;
            lVar29 = lVar29 + 1;
          }
          pcVar2 = block + lVar29;
          bVar34 = true;
          lVar30 = 0;
          lVar28 = lVar29;
          while ((cVar1 = block[lVar28], cVar1 != '\n' && (cVar1 != '\r'))) {
            lVar28 = lVar28 + 1;
            lVar30 = lVar30 + 1;
            bVar34 = lVar28 < lVar27;
            if (lVar27 <= lVar28) goto LAB_001f73d6;
          }
          if (!bVar34) break;
          block[lVar28] = 0;
          if (((*pcVar2 != '\x1a') && (*pcVar2 != '#')) && (lVar29 < lVar28)) {
            options._8_8_ = pcVar2;
            local_88 = FVar11;
            local_80 = lVar27;
            iVar10 = (*(code *)auStack_78)(pcVar2,lVar30,local_d0,auStack_78,local_50);
            local_c8 = CONCAT44(local_c8._4_4_,iVar10);
            if (iVar10 == -1) {
              uVar8 = (*(code *)auStack_78)(options._8_8_,lVar30,local_d0,auStack_78,local_50);
              local_c8 = CONCAT44(local_c8._4_4_,uVar8);
            }
            pFVar25 = local_48;
            FVar11 = local_88;
            block = local_98;
            lVar27 = local_80;
            memory = local_58;
            if ((int)local_c8 != 0) goto LAB_001f74b0;
          }
          local_d0 = local_d0 + 1;
          block[lVar28] = cVar1;
          lVar29 = lVar28 + 1;
          iVar10 = 0x100;
          if (cVar1 == '\r') {
            iVar10 = 10;
          }
          if (cVar1 == '\n') {
            iVar10 = 0xd;
          }
          bVar34 = true;
        }
LAB_001f73d6:
        pFVar25 = local_48;
        if (FVar11 == 0) break;
        if (lVar29 != 0) {
          memmove(block,block + lVar29,__n);
          sVar14 = __n;
          block = local_98;
          goto LAB_001f7280;
        }
        if (local_90 < 0x10000) {
          uVar26 = local_90 * 2;
          local_88 = FVar11;
          local_80 = lVar27;
          block = (undefined1 *)
                  ft_mem_realloc(local_58,1,local_90,uVar26,block,(FT_Error *)&local_c8);
          bVar34 = (int)local_c8 == 0;
          __n = local_88;
          lVar29 = local_80;
          local_90 = uVar17;
          if (bVar34) {
            sVar14 = uVar17;
            local_90 = uVar26;
          }
        }
        else {
          local_c8 = CONCAT44(local_c8._4_4_,6);
          bVar34 = false;
          __n = FVar11;
          lVar29 = lVar27;
          local_90 = uVar17;
        }
        pFVar25 = local_48;
      } while (bVar34);
    }
LAB_001f74b0:
    bdfface = local_40;
    ft_mem_free(memory,block);
    local_38 = (int)local_c8;
    if ((int)local_c8 == 0) {
      uVar17 = local_50[7];
      if (uVar17 != 0) {
        if (*(int *)(uVar17 + 0x30) != 8) {
          *(undefined2 *)(uVar17 + 0x34) = *(undefined2 *)(uVar17 + 8);
        }
        if (local_50[1] != *(long *)(uVar17 + 0x70) + *(long *)(uVar17 + 0x58)) {
          *(undefined2 *)(uVar17 + 0x880f0) = 1;
        }
        if ((*(long *)(uVar17 + 0x70) != 0 || *(long *)(uVar17 + 0x58) != 0) &&
           (*(int *)local_50[8] != 0)) {
          sVar6 = (short)local_50[3];
          uVar9 = (int)*(short *)((long)local_50 + 0x1c) - (int)sVar6;
          if (uVar9 != *(ushort *)(uVar17 + 8)) {
            *(short *)(uVar17 + 8) = (short)uVar9;
            *(undefined2 *)(uVar17 + 0x880f0) = 1;
          }
          if (*(short *)(uVar17 + 0xc) != sVar6) {
            *(short *)(uVar17 + 0xc) = sVar6;
            *(undefined2 *)(uVar17 + 0x880f0) = 1;
          }
          sVar6 = *(short *)((long)local_50 + 0x1e);
          if (*(short *)(uVar17 + 0x10) != sVar6) {
            *(short *)(uVar17 + 0x10) = sVar6;
            *(undefined2 *)(uVar17 + 0x880f0) = 1;
          }
          sVar24 = (short)local_50[4];
          if (*(short *)(uVar17 + 0x12) != sVar24) {
            *(short *)(uVar17 + 0x12) = sVar24;
            *(short *)(uVar17 + 0xe) = -sVar24;
            *(undefined2 *)(uVar17 + 0x880f0) = 1;
          }
          if ((int)sVar24 + (int)sVar6 != (uint)*(ushort *)(uVar17 + 10)) {
            *(short *)(uVar17 + 10) = (short)((int)sVar24 + (int)sVar6);
          }
        }
      }
      if ((*local_50 & 1) == 0) {
        if (uVar17 == 0) {
          local_38 = 3;
        }
        else {
          lVar29 = *(long *)(uVar17 + 0xa0);
          if (lVar29 != 0) {
            pvVar18 = ft_mem_realloc(*(FT_Memory *)(uVar17 + 0x880f8),1,lVar29,lVar29 + 1,
                                     *(void **)(uVar17 + 0x98),&local_38);
            uVar17 = local_50[7];
            *(FT_Pointer *)(uVar17 + 0x98) = pvVar18;
            pFVar25 = local_48;
            if (local_38 != 0) goto LAB_001f74d0;
            *(undefined1 *)((long)pvVar18 + *(long *)(uVar17 + 0xa0)) = 0;
          }
        }
        font_00 = (bdf_font_t *)local_50[7];
        P = local_50;
        goto LAB_001f74fa;
      }
      if ((*local_50 & 0x20) == 0) {
        local_38 = 0xb9;
      }
      else {
        local_38 = 0xba;
      }
    }
LAB_001f74d0:
    bdf_free_font((bdf_font_t *)local_50[7]);
    ft_mem_free(pFVar25,(void *)local_50[7]);
    local_50[7] = 0;
    P = local_50;
  }
  font_00 = (bdf_font_t *)0x0;
LAB_001f74fa:
  if (P != (ulong *)0x0) {
    if ((FT_Memory)P[0x880c] != (FT_Memory)0x0) {
      ft_mem_free((FT_Memory)P[0x880c],(void *)P[0x8809]);
      P[0x880b] = 0;
      P[0x880c] = 0;
      P[0x8809] = 0;
      P[0x880a] = 0;
    }
    pFVar25 = local_48;
    ft_mem_free(local_48,(void *)P[5]);
    P[5] = 0;
    ft_mem_free(pFVar25,P);
  }
  local_34 = local_38;
  if ((char)local_38 == -0x50) {
    BDF_Face_Done(bdfface);
    local_34 = 2;
  }
  else if (local_38 == 0) {
    bdfface[1].face_flags = (FT_Long)font_00;
    if ((short)local_9c == 0 || local_9c < 1) {
      bdfface->num_faces = 1;
      bdfface->face_index = 0;
      *(byte *)&bdfface->face_flags = (byte)bdfface->face_flags | 0x92;
      pbVar12 = bdf_get_font_property(font_00,"SPACING");
      if (((pbVar12 != (bdf_property_t *)0x0) && (pbVar12->format == 1)) &&
         (((byte *)(pbVar12->value).atom != (byte *)0x0 &&
          ((uVar9 = (byte)*(pbVar12->value).atom - 0x43, uVar9 < 0x2b &&
           ((0x40100000401U >> ((ulong)uVar9 & 0x3f) & 1) != 0)))))) {
        *(byte *)&bdfface->face_flags = (byte)bdfface->face_flags | 4;
      }
      pbVar12 = bdf_get_font_property(font_00,"FAMILY_NAME");
      if ((pbVar12 == (bdf_property_t *)0x0) || ((pbVar12->value).atom == (char *)0x0)) {
        bdfface->family_name = (FT_String *)0x0;
      }
      else {
        pFVar13 = (FT_String *)ft_mem_strdup(local_48,(pbVar12->value).atom,&local_34);
        bdfface->family_name = pFVar13;
        if (local_34 != 0) {
          return local_34;
        }
      }
      local_38 = 0;
      pFVar25 = bdfface->memory;
      font = (bdf_font_t *)bdfface[1].face_flags;
      local_68 = (char *)0x0;
      pcStack_60 = (char *)0x0;
      auStack_78 = (undefined1  [8])0x0;
      cb = (_bdf_line_func_t)0x0;
      bdfface->style_flags = 0;
      pbVar12 = bdf_get_font_property(font,"SLANT");
      if ((((pbVar12 != (bdf_property_t *)0x0) && (pbVar12->format == 1)) &&
          ((byte *)(pbVar12->value).atom != (byte *)0x0)) &&
         ((uVar9 = (byte)*(pbVar12->value).atom - 0x49, uVar9 < 0x27 &&
          ((0x4100000041U >> ((ulong)uVar9 & 0x3f) & 1) != 0)))) {
        *(byte *)&local_40->style_flags = (byte)local_40->style_flags | 1;
        local_68 = "Italic";
        if ((*(pbVar12->value).atom & 0xdfU) == 0x4f) {
          local_68 = "Oblique";
        }
      }
      pbVar12 = bdf_get_font_property(font,"WEIGHT_NAME");
      if (((pbVar12 != (bdf_property_t *)0x0) && (pbVar12->format == 1)) &&
         (((byte *)(pbVar12->value).atom != (byte *)0x0 &&
          ((byte)(*(pbVar12->value).atom | 0x20U) == 0x62)))) {
        *(byte *)&local_40->style_flags = (byte)local_40->style_flags | 2;
        cb = (_bdf_line_func_t)0x25a622;
      }
      pbVar12 = bdf_get_font_property(font,"SETWIDTH_NAME");
      if ((((pbVar12 != (bdf_property_t *)0x0) && (pbVar12->format == 1)) &&
          (pcVar2 = (pbVar12->value).atom, pcVar2 != (char *)0x0)) &&
         (((cVar1 = *pcVar2, cVar1 != '\0' && (cVar1 != 'N')) && (cVar1 != 'n')))) {
        pcStack_60 = pcVar2;
      }
      pbVar12 = bdf_get_font_property(font,"ADD_STYLE_NAME");
      if (((pbVar12 != (bdf_property_t *)0x0) && (pbVar12->format == 1)) &&
         ((pFVar32 = (FT_Face)(pbVar12->value).atom, pFVar32 != (FT_Face)0x0 &&
          (((cVar1 = (char)pFVar32->num_faces, cVar1 != '\0' && (cVar1 != 'N')) && (cVar1 != 'n'))))
         )) {
        auStack_78 = (undefined1  [8])pFVar32;
      }
      FVar31 = 0;
      lVar29 = 0;
      do {
        (&local_c8)[lVar29] = 0;
        if (*(char **)(auStack_78 + lVar29 * 8) != (char *)0x0) {
          sVar14 = strlen(*(char **)(auStack_78 + lVar29 * 8));
          (&local_c8)[lVar29] = sVar14;
          FVar31 = FVar31 + sVar14 + 1;
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != 4);
      if (FVar31 == 0) {
        auStack_78 = (undefined1  [8])0x259a29;
        local_c8 = 7;
        FVar31 = 8;
      }
      pFVar13 = (FT_String *)ft_mem_alloc(pFVar25,FVar31,&local_38);
      FVar5 = local_38;
      local_40->style_name = pFVar13;
      pFVar32 = local_40;
      if (local_38 == 0) {
        lVar29 = 0;
        do {
          __src = *(void **)(auStack_78 + lVar29 * 8);
          if (__src != (void *)0x0) {
            sVar14 = (&local_c8)[lVar29];
            if (pFVar13 != pFVar32->style_name) {
              *pFVar13 = ' ';
              pFVar13 = pFVar13 + 1;
            }
            memcpy(pFVar13,__src,sVar14);
            if (((lVar29 == 3) || (lVar29 == 0)) && (sVar14 != 0)) {
              sVar15 = 0;
              do {
                if (pFVar13[sVar15] == ' ') {
                  pFVar13[sVar15] = '-';
                }
                sVar15 = sVar15 + 1;
              } while (sVar14 != sVar15);
            }
            pFVar13 = pFVar13 + sVar14;
            pFVar32 = local_40;
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != 4);
        *pFVar13 = '\0';
      }
      local_34 = FVar5;
      if (FVar5 == 0) {
        local_34 = local_38;
      }
      if (local_34 == 0) {
        pFVar32->num_glyphs = font_00->glyphs_size + 1;
        pFVar32->num_fixed_sizes = 1;
        pFVar16 = (FT_Bitmap_Size *)ft_mem_realloc(local_48,0x20,0,1,(void *)0x0,&local_34);
        pFVar32->available_sizes = pFVar16;
        if (local_34 == 0) {
          pFVar16->x_ppem = 0;
          pFVar16->y_ppem = 0;
          pFVar16->height = 0;
          pFVar16->width = 0;
          *(undefined4 *)&pFVar16->field_0x4 = 0;
          pFVar16->size = 0;
          if (font_00->font_ascent - 0x8000U < 0xffffffffffff0001) {
            lVar29 = 0x7fff;
            if (font_00->font_ascent < 0) {
              lVar29 = -0x7fff;
            }
            font_00->font_ascent = lVar29;
          }
          if (font_00->font_descent - 0x8000U < 0xffffffffffff0001) {
            lVar29 = 0x7fff;
            if (font_00->font_descent < 0) {
              lVar29 = -0x7fff;
            }
            font_00->font_descent = lVar29;
          }
          pFVar16->height = (short)(int)font_00->font_descent + (short)(int)font_00->font_ascent;
          pbVar12 = bdf_get_font_property(font_00,"AVERAGE_WIDTH");
          if (pbVar12 == (bdf_property_t *)0x0) {
            FVar31 = FT_MulDiv((long)pFVar16->height,2,3);
            sVar6 = (short)FVar31;
          }
          else {
            sVar6 = 0x7fff;
            if (0xfffffffffff6001c < (pbVar12->value).l - 0x4fff2U) {
              auVar4 = SEXT816((pbVar12->value).l + 5) * SEXT816(0x6666666666666667);
              sVar24 = (short)(auVar4._8_4_ >> 2) - (auVar4._14_2_ >> 0xf);
              sVar6 = -sVar24;
              if (0 < sVar24) {
                sVar6 = sVar24;
              }
            }
          }
          pFVar16->width = sVar6;
          pbVar12 = bdf_get_font_property(font_00,"POINT_SIZE");
          if (pbVar12 == (bdf_property_t *)0x0) {
            uVar17 = font_00->point_size;
            if (uVar17 == 0) {
              FVar31 = (long)pFVar16->width << 6;
            }
            else {
              FVar31 = 0x7fff;
              if (uVar17 < 0x8000) {
                FVar31 = uVar17 << 6;
              }
            }
          }
          else {
            lVar29 = (pbVar12->value).l;
            FVar31 = 0x7fff;
            if (0xfffffffffff5f67a < lVar29 - 0x504c3U) {
              lVar27 = -lVar29;
              if (0 < lVar29) {
                lVar27 = lVar29;
              }
              FVar31 = FT_MulDiv(lVar27,0x70800,0x11a4e);
            }
          }
          pFVar16->size = FVar31;
          pbVar12 = bdf_get_font_property(font_00,"PIXEL_SIZE");
          if (pbVar12 != (bdf_property_t *)0x0) {
            uVar17 = 0x1fffc0;
            if (0xffffffffffff0000 < (pbVar12->value).l - 0x8000U) {
              iVar22 = (int)(short)(pbVar12->value).l;
              iVar10 = -iVar22;
              if (0 < iVar22) {
                iVar10 = iVar22;
              }
              uVar17 = (ulong)(uint)(iVar10 << 6);
            }
            pFVar16->y_ppem = uVar17;
          }
          pbVar12 = bdf_get_font_property(font_00,"RESOLUTION_X");
          paVar23 = &pbVar12->value;
          if (pbVar12 == (bdf_property_t *)0x0) {
            paVar23 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_x;
          }
          lVar29 = paVar23->l;
          if (lVar29 == 0) {
            sVar6 = 0;
          }
          else {
            sVar6 = 0x7fff;
            if (0xffffffffffff0000 < lVar29 - 0x8000U) {
              sVar24 = (short)lVar29;
              sVar6 = -sVar24;
              if (0 < sVar24) {
                sVar6 = sVar24;
              }
            }
          }
          pbVar12 = bdf_get_font_property(font_00,"RESOLUTION_Y");
          paVar23 = &pbVar12->value;
          if (pbVar12 == (bdf_property_t *)0x0) {
            paVar23 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_y;
          }
          lVar29 = paVar23->l;
          if (lVar29 == 0) {
            sVar24 = 0;
          }
          else {
            sVar24 = 0x7fff;
            if (0xffffffffffff0000 < lVar29 - 0x8000U) {
              sVar7 = (short)lVar29;
              sVar24 = -sVar7;
              if (0 < sVar7) {
                sVar24 = sVar7;
              }
            }
          }
          if (pFVar16->y_ppem == 0) {
            pFVar16->y_ppem = pFVar16->size;
            if (sVar24 != 0) {
              FVar31 = FT_MulDiv(pFVar16->size,(long)sVar24,0x48);
              pFVar16->y_ppem = FVar31;
            }
          }
          FVar31 = pFVar16->y_ppem;
          if ((sVar6 != 0) && (sVar24 != 0)) {
            FVar31 = FT_MulDiv(FVar31,(long)sVar6,(long)sVar24);
          }
          pFVar16->x_ppem = FVar31;
          pbVar3 = font_00->glyphs;
          pvVar18 = ft_mem_realloc(local_48,0x10,0,font_00->glyphs_size,(void *)0x0,&local_34);
          pFVar32 = local_40;
          local_40[1].style_flags = (FT_Long)pvVar18;
          if (local_34 == 0) {
            local_40[1].num_fixed_sizes = 0;
            uVar17 = font_00->glyphs_size;
            if (uVar17 != 0) {
              lVar29 = font_00->default_char;
              puVar19 = (undefined2 *)((long)pvVar18 + 8);
              plVar33 = &pbVar3->encoding;
              uVar26 = 0;
              do {
                lVar27 = *plVar33;
                *(long *)(puVar19 + -4) = lVar27;
                *puVar19 = (short)uVar26;
                if ((uVar26 < 0xffffffff) && (lVar27 == lVar29)) {
                  local_40[1].num_fixed_sizes = (FT_Int)uVar26;
                }
                uVar26 = uVar26 + 1;
                puVar19 = puVar19 + 8;
                plVar33 = plVar33 + 7;
              } while (uVar17 != uVar26);
            }
          }
          if (local_34 == 0) {
            pbVar12 = bdf_get_font_property(font_00,"CHARSET_REGISTRY");
            pbVar20 = bdf_get_font_property(font_00,"CHARSET_ENCODING");
            if ((((pbVar20 == (bdf_property_t *)0x0 || pbVar12 == (bdf_property_t *)0x0) ||
                 (pbVar12->format != 1)) || (pbVar20->format != 1)) ||
               (((pbVar12->value).atom == (char *)0x0 || ((pbVar20->value).atom == (char *)0x0)))) {
              auStack_78 = (undefined1  [8])pFVar32;
              cb = (_bdf_line_func_t)0x741444f42;
              local_34 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)auStack_78,
                                     (FT_CMap_conflict *)0x0);
              if (pFVar32->num_charmaps != 0) {
                pFVar32->charmap = *pFVar32->charmaps;
              }
            }
            else {
              pvVar18 = ft_mem_strdup(local_48,(pbVar20->value).atom,&local_34);
              pFVar32[1].num_faces = (FT_Long)pvVar18;
              if (local_34 == 0) {
                pbVar21 = (byte *)ft_mem_strdup(local_48,(pbVar12->value).atom,&local_34);
                local_40[1].face_index = (FT_Long)pbVar21;
                if (local_34 == 0) {
                  bVar34 = true;
                  if ((((*pbVar21 | 0x20) == 0x69) && ((pbVar21[1] | 0x20) == 0x73)) &&
                     ((pbVar21[2] | 0x20) == 0x6f)) {
                    pbVar21 = pbVar21 + 3;
                    iVar10 = strcmp((char *)pbVar21,"10646");
                    if ((iVar10 == 0) ||
                       ((iVar10 = strcmp((char *)pbVar21,"8859"), iVar10 == 0 &&
                        (iVar10 = strcmp((char *)local_40[1].num_faces,"1"), iVar10 == 0)))) {
                      bVar34 = false;
                    }
                    else {
                      iVar10 = strcmp((char *)pbVar21,"646.1991");
                      if (iVar10 == 0) {
                        iVar10 = strcmp((char *)local_40[1].num_faces,"IRV");
                        bVar34 = iVar10 != 0;
                      }
                    }
                  }
                  auStack_78 = (undefined1  [8])local_40;
                  cb = (_bdf_line_func_t)0x0;
                  if (!bVar34) {
                    cb = (_bdf_line_func_t)0x10003756e6963;
                  }
                  local_34 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)auStack_78,
                                         (FT_CMap_conflict *)0x0);
                }
              }
            }
          }
        }
      }
    }
    else {
      BDF_Face_Done(bdfface);
      local_34 = 6;
    }
  }
  return local_34;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Face_Init( FT_Stream      stream,
                 FT_Face        bdfface,        /* BDF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    FT_Error       error  = FT_Err_Ok;
    BDF_Face       face   = (BDF_Face)bdfface;
    FT_Memory      memory = FT_FACE_MEMORY( face );

    bdf_font_t*    font = NULL;
    bdf_options_t  options;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "BDF driver\n" ));

    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    options.correct_metrics = 1;   /* FZ XXX: options semantics */
    options.keep_unencoded  = 1;
    options.keep_comments   = 0;
    options.font_spacing    = BDF_PROPORTIONAL;

    error = bdf_load_font( stream, memory, &options, &font );
    if ( FT_ERR_EQ( error, Missing_Startfont_Field ) )
    {
      FT_TRACE2(( "  not a BDF file\n" ));
      goto Fail;
    }
    else if ( error )
      goto Exit;

    /* we have a bdf font: let's construct the face object */
    face->bdffont = font;

    /* BDF cannot have multiple faces in a single font file.
     * XXX: non-zero face_index is already invalid argument, but
     *      Type1, Type42 driver has a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "BDF_Face_Init: invalid face index\n" ));
      BDF_Face_Done( bdfface );
      return FT_THROW( Invalid_Argument );
    }

    {
      bdf_property_t*  prop = NULL;


      FT_TRACE4(( "  number of glyphs: allocated %d (used %d)\n",
                  font->glyphs_size,
                  font->glyphs_used ));
      FT_TRACE4(( "  number of unencoded glyphs: allocated %d (used %d)\n",
                  font->unencoded_size,
                  font->unencoded_used ));

      bdfface->num_faces  = 1;
      bdfface->face_index = 0;

      bdfface->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                             FT_FACE_FLAG_HORIZONTAL  |
                             FT_FACE_FLAG_FAST_GLYPHS;

      prop = bdf_get_font_property( font, "SPACING" );
      if ( prop && prop->format == BDF_ATOM                             &&
           prop->value.atom                                             &&
           ( *(prop->value.atom) == 'M' || *(prop->value.atom) == 'm' ||
             *(prop->value.atom) == 'C' || *(prop->value.atom) == 'c' ) )
        bdfface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* FZ XXX: TO DO: FT_FACE_FLAGS_VERTICAL   */
      /* FZ XXX: I need a font to implement this */

      prop = bdf_get_font_property( font, "FAMILY_NAME" );
      if ( prop && prop->value.atom )
      {
        if ( FT_STRDUP( bdfface->family_name, prop->value.atom ) )
          goto Exit;
      }
      else
        bdfface->family_name = NULL;

      if ( FT_SET_ERROR( bdf_interpret_style( face ) ) )
        goto Exit;

      /* the number of glyphs (with one slot for the undefined glyph */
      /* at position 0 and all unencoded glyphs)                     */
      bdfface->num_glyphs = (FT_Long)( font->glyphs_size + 1 );

      bdfface->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( bdfface->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = bdfface->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;
        long             value;


        FT_ZERO( bsize );

        /* sanity checks */
        if ( font->font_ascent > 0x7FFF || font->font_ascent < -0x7FFF )
        {
          font->font_ascent = font->font_ascent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font ascent to value %d\n",
                      font->font_ascent ));
        }
        if ( font->font_descent > 0x7FFF || font->font_descent < -0x7FFF )
        {
          font->font_descent = font->font_descent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font descent to value %d\n",
                      font->font_descent ));
        }

        bsize->height = (FT_Short)( font->font_ascent + font->font_descent );

        prop = bdf_get_font_property( font, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative average width\n" ));
#endif
          if ( prop->value.l >    0x7FFFL * 10 - 5   ||
               prop->value.l < -( 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = bdf_get_font_property( font, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( prop->value.l >  0x504C2L || /* 0x7FFF * 72270/7200 */
               prop->value.l < -0x504C2L )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }
        else if ( font->point_size )
        {
          if ( font->point_size > 0x7FFF )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = (FT_Pos)font->point_size << 6;
        }
        else
        {
          /* this is a heuristical value */
          bsize->size = bsize->width * 64;
        }

        prop = bdf_get_font_property( font, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative pixel size\n" ));
#endif
          if ( prop->value.l > 0x7FFF || prop->value.l < -0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "BDF_Face_Init: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = bdf_get_font_property( font, "RESOLUTION_X" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_x;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative X resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)value );
        }

        prop = bdf_get_font_property( font, "RESOLUTION_Y" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_y;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative Y resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)value );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* encoding table */
      {
        bdf_glyph_t*   cur = font->glyphs;
        unsigned long  n;


        if ( FT_NEW_ARRAY( face->en_table, font->glyphs_size ) )
          goto Exit;

        face->default_glyph = 0;
        for ( n = 0; n < font->glyphs_size; n++ )
        {
          (face->en_table[n]).enc = cur[n].encoding;
          FT_TRACE4(( "  idx %d, val 0x%lX\n", n, cur[n].encoding ));
          (face->en_table[n]).glyph = (FT_UShort)n;

          if ( cur[n].encoding == font->default_char )
          {
            if ( n < FT_UINT_MAX )
              face->default_glyph = (FT_UInt)n;
            else
              FT_TRACE1(( "BDF_Face_Init:"
                          " idx %d is too large for this system\n", n ));
          }
        }
      }

      /* charmaps */
      {
        bdf_property_t  *charset_registry, *charset_encoding;
        FT_Bool          unicode_charmap  = 0;


        charset_registry =
          bdf_get_font_property( font, "CHARSET_REGISTRY" );
        charset_encoding =
          bdf_get_font_property( font, "CHARSET_ENCODING" );
        if ( charset_registry && charset_encoding )
        {
          if ( charset_registry->format == BDF_ATOM &&
               charset_encoding->format == BDF_ATOM &&
               charset_registry->value.atom         &&
               charset_encoding->value.atom         )
          {
            const char*  s;


            if ( FT_STRDUP( face->charset_encoding,
                            charset_encoding->value.atom ) ||
                 FT_STRDUP( face->charset_registry,
                            charset_registry->value.atom ) )
              goto Exit;

            /* Uh, oh, compare first letters manually to avoid dependency */
            /* on locales.                                                */
            s = face->charset_registry;
            if ( ( s[0] == 'i' || s[0] == 'I' ) &&
                 ( s[1] == 's' || s[1] == 'S' ) &&
                 ( s[2] == 'o' || s[2] == 'O' ) )
            {
              s += 3;
              if ( !ft_strcmp( s, "10646" )                      ||
                   ( !ft_strcmp( s, "8859" ) &&
                     !ft_strcmp( face->charset_encoding, "1" ) ) )
                unicode_charmap = 1;
              /* another name for ASCII */
              else if ( !ft_strcmp( s, "646.1991" )                 &&
                        !ft_strcmp( face->charset_encoding, "IRV" ) )
                unicode_charmap = 1;
            }

            {
              FT_CharMapRec  charmap;


              charmap.face        = FT_FACE( face );
              charmap.encoding    = FT_ENCODING_NONE;
              /* initial platform/encoding should indicate unset status? */
              charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
              charmap.encoding_id = TT_APPLE_ID_DEFAULT;

              if ( unicode_charmap )
              {
                charmap.encoding    = FT_ENCODING_UNICODE;
                charmap.platform_id = TT_PLATFORM_MICROSOFT;
                charmap.encoding_id = TT_MS_ID_UNICODE_CS;
              }

              error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );
            }

            goto Exit;
          }
        }

        /* otherwise assume Adobe standard encoding */

        {
          FT_CharMapRec  charmap;


          charmap.face        = FT_FACE( face );
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.platform_id = TT_PLATFORM_ADOBE;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;

          error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );

          /* Select default charmap */
          if ( bdfface->num_charmaps )
            bdfface->charmap = bdfface->charmaps[0];
        }
      }
    }

  Exit:
    return error;

  Fail:
    BDF_Face_Done( bdfface );
    return FT_THROW( Unknown_File_Format );
  }